

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutPool.cpp
# Opt level: O0

void __thiscall HighsCutPool::lpCutRemoved(HighsCutPool *this,HighsInt cut)

{
  bool bVar1;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *this_00;
  reference pvVar2;
  reference pvVar3;
  int in_ESI;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffb8;
  HighsInt in_stack_ffffffffffffffbc;
  HighsDynamicRowMatrix *in_stack_ffffffffffffffc0;
  int *in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffd9;
  undefined4 in_stack_ffffffffffffffe0;
  
  bVar1 = HighsDynamicRowMatrix::columnsLinked(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  if (bVar1) {
    this_00 = (set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
               *)(in_RDI + 0x218);
    std::make_pair<int,int&>
              ((int *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),(int *)0x5ab06d)
    ;
    std::
    set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::erase(this_00,(key_type *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    std::set<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>::
    emplace<int,int&>((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                       *)CONCAT44(1,in_stack_ffffffffffffffe0),
                      (int *)CONCAT71(in_stack_ffffffffffffffd9,in_stack_ffffffffffffffd8),
                      in_stack_ffffffffffffffd0);
  }
  pvVar2 = std::vector<short,_std::allocator<short>_>::operator[]
                     ((vector<short,_std::allocator<short>_> *)(in_RDI + 0x168),(long)in_ESI);
  *pvVar2 = 1;
  *(int *)(in_RDI + 0x268) = *(int *)(in_RDI + 0x268) + -1;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x278),1);
  *pvVar3 = *pvVar3 + 1;
  return;
}

Assistant:

void HighsCutPool::lpCutRemoved(HighsInt cut) {
  if (matrix_.columnsLinked(cut)) {
    propRows.erase(std::make_pair(-1, cut));
    propRows.emplace(1, cut);
  }
  ages_[cut] = 1;
  --numLpCuts;
  ++ageDistribution[1];
}